

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidget::collapseItem(QTreeWidget *this,QTreeWidgetItem *item)

{
  long lVar1;
  QTreeWidgetPrivate *__s;
  QTreeModel *m;
  int in_ESI;
  long in_FS_OFFSET;
  QTreeWidgetPrivate *d;
  SkipSorting skipSorting;
  QModelIndex *in_stack_ffffffffffffffe0;
  QTreeModel *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = d_func((QTreeWidget *)0x91913f);
  this_00 = (QTreeModel *)&DAT_aaaaaaaaaaaaaaaa;
  m = QTreeWidgetPrivate::treeModel((QTreeWidgetPrivate *)0x91915a);
  QTreeModel::SkipSorting::SkipSorting((SkipSorting *)&stack0xffffffffffffffe8,m);
  QTreeWidgetPrivate::index((QTreeWidgetPrivate *)&stack0xffffffffffffffd0,(char *)__s,in_ESI);
  QTreeView::collapse((QTreeView *)this_00,in_stack_ffffffffffffffe0);
  QTreeModel::SkipSorting::~SkipSorting((SkipSorting *)&stack0xffffffffffffffe8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidget::collapseItem(const QTreeWidgetItem *item)
{
    Q_D(QTreeWidget);
    QTreeModel::SkipSorting skipSorting(d->treeModel());
    collapse(d->index(item));
}